

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O0

void __thiscall QOpenGLWidget::QOpenGLWidget(QOpenGLWidget *this,QWidget *parent,WindowFlags f)

{
  long lVar1;
  byte bVar2;
  QWidgetPrivate *pQVar3;
  QPlatformIntegration *pQVar4;
  uint in_EDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QOpenGLWidgetPrivate *d;
  char *in_stack_ffffffffffffff98;
  int line;
  undefined7 in_stack_ffffffffffffffb0;
  byte bVar5;
  QOpenGLWidgetPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QWidgetPrivate *)operator_new(0x2c0);
  QOpenGLWidgetPrivate::QOpenGLWidgetPrivate(in_stack_ffffffffffffffd0);
  QWidget::QWidget(in_RDI,pQVar3,in_RSI,(QFlags_conflict *)(ulong)in_EDX);
  line = (int)((ulong)pQVar3 >> 0x20);
  *(undefined ***)in_RDI = &PTR_metaObject_00113410;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QOpenGLWidget_001135d8;
  d_func((QOpenGLWidget *)0x10940e);
  pQVar4 = QGuiApplicationPrivate::platformIntegration();
  bVar2 = (**(code **)(*(long *)pQVar4 + 0x10))(pQVar4,0x17);
  bVar5 = 1;
  if ((bVar2 & 1) != 0) {
    pQVar4 = QGuiApplicationPrivate::platformIntegration();
    bVar5 = (**(code **)(*(long *)pQVar4 + 0x10))(pQVar4,2);
    bVar5 = bVar5 ^ 0xff;
  }
  if ((bVar5 & 1) == 0) {
    QWidgetPrivate::setRenderToTexture((QWidgetPrivate *)0x10948e);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar5,in_stack_ffffffffffffffb0),(char *)in_RDI,line,
               in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (&stack0xffffffffffffffd0,"QOpenGLWidget is not supported on this platform.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QOpenGLWidget::QOpenGLWidget(QWidget *parent, Qt::WindowFlags f)
    : QWidget(*(new QOpenGLWidgetPrivate), parent, f)
{
    Q_D(QOpenGLWidget);
    if (Q_UNLIKELY(!QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::RhiBasedRendering)
                   || !QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::OpenGL)))
        qWarning("QOpenGLWidget is not supported on this platform.");
    else
        d->setRenderToTexture();
}